

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

Expression *
slang::ast::DistExpression::fromSyntax
          (Compilation *comp,ExpressionOrDistSyntax *syntax,ASTContext *context)

{
  undefined2 uVar1;
  LanguageVersion LVar2;
  DistConstraintListSyntax *pDVar3;
  SyntaxNode *pSVar4;
  SyntaxNode *pSVar5;
  Type *pTVar6;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  bool bVar7;
  ExpressionOrDistSyntax *pEVar8;
  Compilation *compilation;
  bool bVar9;
  bool bVar10;
  int iVar11;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar12;
  undefined4 extraout_var;
  Type *pTVar14;
  Diagnostic *pDVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DistExpression *expr;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *src;
  long lVar16;
  Kind KVar17;
  undefined4 uVar18;
  ulong uVar19;
  SourceRange sourceRange;
  string_view arg;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  SmallVector<slang::ast::DistExpression::DistItem,_4UL> items;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffffe18;
  DistItem local_1c8;
  ExpressionOrDistSyntax *local_1a8;
  long local_1a0;
  Expression *local_198;
  Compilation *local_190;
  Expression *local_188;
  _Storage<slang::ast::DistExpression::DistWeight,_true> local_180;
  undefined1 local_170;
  ExpressionSyntax *local_168;
  pointer ppEStack_160;
  EVP_PKEY_CTX *local_158;
  undefined8 local_150;
  undefined8 local_148;
  EVP_PKEY_CTX local_140 [40];
  ExpressionSyntax *local_118;
  pointer local_110;
  undefined8 local_108;
  ExpressionSyntax local_100;
  SourceRange local_d8;
  SmallVectorBase<slang::ast::DistExpression::DistItem> local_c8 [2];
  Expression *pEVar13;
  
  local_118 = &local_100;
  local_110 = (pointer)0x0;
  local_108 = 5;
  pDVar3 = (syntax->distribution).ptr;
  uVar19 = (pDVar3->items).elements._M_extent._M_extent_value + 1;
  local_1a8 = syntax;
  if (1 < uVar19) {
    uVar19 = uVar19 >> 1;
    lVar16 = 0;
    do {
      ppSVar12 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((long)&(((pDVar3->items).elements._M_ptr)->super_ConstTokenOrSyntax).
                                    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                            + lVar16));
      if ((*ppSVar12)->kind == DistItem) {
        local_c8[0].data_ = *(pointer *)(*ppSVar12 + 1);
        SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
        emplace_back<slang::syntax::ExpressionSyntax_const*>
                  ((SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *)&local_118,
                   (ExpressionSyntax **)local_c8);
      }
      lVar16 = lVar16 + 0x30;
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
  }
  pEVar8 = local_1a8;
  LVar2 = (comp->options).languageVersion;
  local_158 = local_140;
  local_150 = 0;
  local_148 = 5;
  expressions_00._M_extent._M_extent_value = (size_t)&local_158;
  expressions_00._M_ptr = local_110;
  local_168 = local_118;
  ppEStack_160 = local_110;
  bVar9 = Expression::bindMembershipExpressions
                    ((Expression *)context,(ASTContext *)0x8a,(ushort)((int)LVar2 < 1),false,false,
                     true,SUB81((local_1a8->expr).ptr,0),local_118,expressions_00,
                     in_stack_fffffffffffffe18);
  pEVar13 = *(Expression **)local_158;
  if ((int)LVar2 < 1 || !bVar9) {
    bVar9 = 0 < (int)LVar2 || !bVar9;
    src = local_158;
  }
  else {
    bVar9 = Type::isNumeric((pEVar13->type).ptr);
    if (bVar9) {
      bVar9 = false;
      src = extraout_RDX;
    }
    else {
      pDVar15 = ASTContext::addDiag(context,(DiagCode)0x270007,pEVar13->sourceRange);
      pDVar15 = ast::operator<<(pDVar15,(pEVar13->type).ptr);
      bVar9 = true;
      arg._M_str = "dist";
      arg._M_len = 4;
      Diagnostic::operator<<(pDVar15,arg);
      src = extraout_RDX_00;
    }
  }
  local_170 = 0;
  local_c8[0].data_ = (pointer)local_c8[0].firstElement;
  local_c8[0].len = 0;
  local_c8[0].cap = 4;
  pDVar3 = (pEVar8->distribution).ptr;
  uVar19 = (pDVar3->items).elements._M_extent._M_extent_value + 1;
  local_198 = pEVar13;
  local_190 = comp;
  if (1 < uVar19) {
    uVar19 = uVar19 >> 1;
    local_1a0 = 1;
    lVar16 = 0;
    bVar7 = false;
    do {
      ppSVar12 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((long)&(((pDVar3->items).elements._M_ptr)->super_ConstTokenOrSyntax).
                                    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                            + lVar16));
      pSVar4 = *ppSVar12;
      if (pSVar4->kind == DistItem) {
        local_1c8.value = *(Expression **)(local_158 + local_1a0 * 8);
        local_1c8.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
             false;
        pSVar4 = pSVar4[1].parent;
        if (pSVar4 != (SyntaxNode *)0x0) {
          uVar1 = (undefined2)pSVar4[1].kind;
          if (uVar1 == ArithmeticShiftRightExpression) {
LAB_004a5608:
            uVar18 = 1;
          }
          else {
            uVar18 = 0;
            if ((uVar1 == ArithmeticRightShiftAssignmentExpression) &&
               (uVar18 = 0, *(short *)&pSVar4[1].previewNode == 0x1a)) goto LAB_004a5608;
          }
          iVar11 = Expression::bind((int)pSVar4[2].parent,(sockaddr *)context,0);
          pEVar13 = (Expression *)CONCAT44(extraout_var,iVar11);
          bVar10 = ASTContext::requireIntegral(context,pEVar13);
          bVar9 = (bool)(!bVar10 | bVar9);
          local_1c8.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
          _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload
          ._M_value.kind = uVar18;
          local_1c8.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
          _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload
          ._M_value.expr = pEVar13;
          if (local_1c8.weight.
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged ==
              false) {
            local_1c8.weight.
            super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged = true;
          }
        }
        if ((local_1c8.value)->kind == ValueRange) {
          pTVar6 = (Type *)((local_1c8.value[1].type.ptr)->super_Symbol).name._M_len;
          pTVar14 = pTVar6->canonical;
          if (pTVar14 == (Type *)0x0) {
            Type::resolveCanonical(pTVar6);
            pTVar14 = pTVar6->canonical;
          }
          if ((((pTVar14->super_Symbol).kind == FloatingType) &&
              (((local_1c8.weight.
                 super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload
                 .super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged !=
                 true || (local_1c8.weight.
                          super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                          _M_payload.
                          super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                          _M_payload._M_value.kind != PerRange)) &&
               (pDVar15 = ASTContext::addDiag(context,(DiagCode)0x490007,
                                              (local_1c8.value)->sourceRange),
               local_1c8.weight.
               super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged ==
               true)))) &&
             (local_1c8.weight.
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
              _M_value.expr != (Expression *)0x0)) {
            Diagnostic::operator<<
                      (pDVar15,(local_1c8.weight.
                                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>
                                ._M_payload._M_value.expr)->sourceRange);
          }
        }
        SmallVectorBase<slang::ast::DistExpression::DistItem>::
        emplace_back<slang::ast::DistExpression::DistItem&>(local_c8,&local_1c8);
        local_1a0 = local_1a0 + 1;
        src = extraout_RDX_03;
      }
      else {
        pSVar5 = pSVar4[1].previewNode;
        src = extraout_RDX_01;
        if (pSVar5 != (SyntaxNode *)0x0) {
          if (bVar7) {
            sourceRange = slang::syntax::SyntaxNode::sourceRange(pSVar4);
            pDVar15 = ASTContext::addDiag(context,(DiagCode)0x750007,sourceRange);
            Diagnostic::addNote(pDVar15,(DiagCode)0xc0001,local_188->sourceRange);
            src = extraout_RDX_02;
          }
          else {
            uVar1 = (undefined2)pSVar5[1].kind;
            if ((uVar1 == ArithmeticShiftRightExpression) ||
               ((KVar17 = PerValue, uVar1 == ArithmeticRightShiftAssignmentExpression &&
                (*(short *)&pSVar5[1].previewNode == 0x1a)))) {
              KVar17 = PerRange;
            }
            iVar11 = Expression::bind((int)pSVar5[2].parent,(sockaddr *)context,0);
            pEVar13 = (Expression *)CONCAT44(extraout_var_00,iVar11);
            bVar10 = ASTContext::requireIntegral(context,pEVar13);
            bVar9 = (bool)(bVar9 | !bVar10);
            src = extraout_RDX_04;
            local_188 = pEVar13;
            local_180._M_value.kind = KVar17;
            local_180._M_value.expr = pEVar13;
            if (!bVar7) {
              local_170 = 1;
              bVar7 = true;
            }
          }
        }
      }
      lVar16 = lVar16 + 0x30;
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
  }
  compilation = local_190;
  pTVar6 = local_190->voidType;
  iVar11 = SmallVectorBase<slang::ast::DistExpression::DistItem>::copy
                     (local_c8,(EVP_PKEY_CTX *)local_190,src);
  pEVar13 = local_198;
  local_1c8.value = (Expression *)CONCAT44(extraout_var_01,iVar11);
  local_d8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_1a8);
  expr = BumpAllocator::
         emplace<slang::ast::DistExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::DistExpression::DistItem,18446744073709551615ul>,std::optional<slang::ast::DistExpression::DistWeight>&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,pTVar6,pEVar13,
                    (span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *)&local_1c8
                    ,(optional<slang::ast::DistExpression::DistWeight> *)&local_180._M_value,
                    &local_d8);
  if (bVar9) {
    expr = (DistExpression *)Expression::badExpr(compilation,&expr->super_Expression);
  }
  if (local_c8[0].data_ != (pointer)local_c8[0].firstElement) {
    operator_delete(local_c8[0].data_);
  }
  if (local_158 != local_140) {
    operator_delete(local_158);
  }
  if (local_118 != &local_100) {
    operator_delete(local_118);
  }
  return &expr->super_Expression;
}

Assistant:

Expression& DistExpression::fromSyntax(Compilation& comp, const ExpressionOrDistSyntax& syntax,
                                       const ASTContext& context) {
    SmallVector<const ExpressionSyntax*> expressions;
    for (auto item : syntax.distribution->items) {
        if (item->kind == SyntaxKind::DistItem)
            expressions.push_back(item->as<DistItemSyntax>().range);
    }

    const bool allowReal = comp.languageVersion() >= LanguageVersion::v1800_2023;

    SmallVector<const Expression*> bound;
    bool bad = !bindMembershipExpressions(
        context, TokenKind::DistKeyword, /* requireIntegral */ !allowReal,
        /* unwrapUnpacked */ false, /* allowTypeReferences */ false,
        /* allowValueRange */ true, *syntax.expr, expressions, bound);

    auto& pred = *bound[0];
    if (allowReal && !bad) {
        if (!pred.type->isNumeric()) {
            context.addDiag(diag::BadSetMembershipType, pred.sourceRange) << *pred.type << "dist"sv;
            bad = true;
        }
    }

    auto createWeight = [&](const DistWeightSyntax& weight) {
        auto weightKind = DistWeight::PerValue;
        if (weight.op.kind == TokenKind::ColonSlash ||
            (weight.op.kind == TokenKind::Colon && weight.extraOp.kind == TokenKind::Slash)) {
            weightKind = DistWeight::PerRange;
        }

        auto& weightExpr = Expression::bind(*weight.expr, context);
        if (!context.requireIntegral(weightExpr))
            bad = true;

        return DistWeight{weightKind, &weightExpr};
    };

    std::optional<DistWeight> defaultWeight;
    SmallVector<DistItem, 4> items;
    size_t index = 1;
    for (auto item : syntax.distribution->items) {
        if (item->kind != SyntaxKind::DistItem) {
            if (auto weight = item->as<DefaultDistItemSyntax>().weight) {
                if (defaultWeight) {
                    auto& diag = context.addDiag(diag::MultipleDefaultDistWeight,
                                                 item->sourceRange());
                    diag.addNote(diag::NotePreviousUsage, defaultWeight->expr->sourceRange);
                }
                else {
                    defaultWeight = createWeight(*weight);
                }
            }
            continue;
        }

        DistItem di{*bound[index++], {}};
        if (auto weight = item->as<DistItemSyntax>().weight)
            di.weight = createWeight(*weight);

        if (di.value.kind == ExpressionKind::ValueRange &&
            di.value.as<ValueRangeExpression>().left().type->isFloating() &&
            (!di.weight || di.weight->kind != DistWeight::PerRange)) {
            auto& diag = context.addDiag(diag::DistRealRangeWeight, di.value.sourceRange);
            if (di.weight && di.weight->expr)
                diag << di.weight->expr->sourceRange;
        }

        items.emplace_back(di);
    }

    auto result = comp.emplace<DistExpression>(comp.getVoidType(), pred, items.copy(comp),
                                               defaultWeight, syntax.sourceRange());
    if (bad)
        return badExpr(comp, result);

    return *result;
}